

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O3

Aig_Man_t * Dar_ManChoiceNewAig(Aig_Man_t *pAig,Dch_Pars_t *pPars)

{
  uint uVar1;
  void *pvVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  void **__ptr;
  Aig_Man_t *pAVar7;
  Aig_Man_t *p;
  size_t sVar8;
  char *__dest;
  char *__dest_00;
  long lVar9;
  long lVar10;
  void *pvVar11;
  uint uVar12;
  uint uVar13;
  timespec ts;
  timespec local_50;
  void *local_40;
  Dch_Pars_t *local_38;
  
  iVar5 = pPars->fVerbose;
  iVar4 = clock_gettime(3,&local_50);
  if (iVar4 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  pVVar6 = Dar_ManChoiceSynthesis(pAig,1,1,pPars->fPower,iVar5);
  iVar5 = clock_gettime(3,&local_50);
  if (iVar5 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  pPars->timeSynth = lVar10 + lVar9;
  uVar1 = pVVar6->nSize;
  if (0 < (int)uVar1) {
    uVar12 = uVar1 - 1;
    if (uVar12 != 0) {
      __ptr = pVVar6->pArray;
      pvVar11 = __ptr[uVar12];
      pvVar2 = *__ptr;
      if (uVar12 == pVVar6->nCap) {
        local_40 = pvVar11;
        local_38 = pPars;
        if (uVar1 < 0x11) {
          __ptr = (void **)realloc(__ptr,0x80);
          uVar13 = 0x10;
        }
        else {
          uVar13 = uVar12 * 2;
          __ptr = (void **)realloc(__ptr,(ulong)uVar13 * 8);
        }
        pVVar6->pArray = __ptr;
        pVVar6->nCap = uVar13;
        pvVar11 = local_40;
        pPars = local_38;
      }
      pVVar6->nSize = uVar1;
      __ptr[uVar12] = pvVar2;
      *__ptr = pvVar11;
      pAVar7 = Dch_DeriveTotalAig(pVVar6);
      if (0 < pVVar6->nSize) {
        lVar9 = 0;
        do {
          Aig_ManStop((Aig_Man_t *)pVVar6->pArray[lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar6->nSize);
      }
      if (pVVar6->pArray != (void **)0x0) {
        free(pVVar6->pArray);
      }
      free(pVVar6);
      p = Dch_ComputeChoices(pAVar7,pPars);
      Aig_ManStop(pAVar7);
      pcVar3 = pAig->pName;
      pvVar11 = pAig->pManTime;
      pAig->pManTime = (void *)0x0;
      if (pcVar3 == (char *)0x0) {
        __dest = (char *)0x0;
      }
      else {
        sVar8 = strlen(pcVar3);
        __dest = (char *)malloc(sVar8 + 1);
        strcpy(__dest,pcVar3);
      }
      pcVar3 = pAig->pSpec;
      if (pcVar3 == (char *)0x0) {
        __dest_00 = (char *)0x0;
      }
      else {
        sVar8 = strlen(pcVar3);
        __dest_00 = (char *)malloc(sVar8 + 1);
        strcpy(__dest_00,pcVar3);
      }
      pVVar6 = Aig_ManOrderPios(p,pAig);
      Aig_ManStop(pAig);
      pAVar7 = Aig_ManDupDfsGuided(p,pVVar6);
      Aig_ManStop(p);
      if (pVVar6->pArray != (void **)0x0) {
        free(pVVar6->pArray);
      }
      free(pVVar6);
      pAVar7->pManTime = pvVar11;
      Aig_ManChoiceLevel(pAVar7);
      if (pAVar7->pName != (char *)0x0) {
        free(pAVar7->pName);
        pAVar7->pName = (char *)0x0;
      }
      if (pAVar7->pSpec != (char *)0x0) {
        free(pAVar7->pSpec);
      }
      pAVar7->pName = __dest;
      pAVar7->pSpec = __dest_00;
      return pAVar7;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
}

Assistant:

Aig_Man_t * Dar_ManChoiceNewAig( Aig_Man_t * pAig, Dch_Pars_t * pPars )
{
//    extern Aig_Man_t * Dch_DeriveTotalAig( Vec_Ptr_t * vAigs );
    extern Aig_Man_t * Dch_ComputeChoices( Aig_Man_t * pAig, Dch_Pars_t * pPars );
    int fVerbose = pPars->fVerbose;
    Aig_Man_t * pMan, * pTemp;
    Vec_Ptr_t * vAigs;
    Vec_Ptr_t * vPios;
    void * pManTime;
    char * pName, * pSpec;
    int i;
    abctime clk;

clk = Abc_Clock();
    vAigs = Dar_ManChoiceSynthesis( pAig, 1, 1, pPars->fPower, fVerbose );
pPars->timeSynth = Abc_Clock() - clk;
    // swap the first and last network
    // this should lead to the primary choice being "better" because of synthesis
    // (it is also important when constructing choices)
    pMan = (Aig_Man_t *)Vec_PtrPop( vAigs );
    Vec_PtrPush( vAigs, Vec_PtrEntry(vAigs,0) );
    Vec_PtrWriteEntry( vAigs, 0, pMan );

    // derive the total AIG
    pMan = Dch_DeriveTotalAig( vAigs );
    // cleanup
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pTemp, i )
        Aig_ManStop( pTemp );
    Vec_PtrFree( vAigs );

    // compute choices
    pMan = Dch_ComputeChoices( pTemp = pMan, pPars );
    Aig_ManStop( pTemp );

    // save useful things
    pManTime = pAig->pManTime; pAig->pManTime = NULL;
    pName = Abc_UtilStrsav( pAig->pName );
    pSpec = Abc_UtilStrsav( pAig->pSpec );

    // create guidence
    vPios = Aig_ManOrderPios( pMan, pAig ); 
    Aig_ManStop( pAig );

    // reconstruct the network
    pMan = Aig_ManDupDfsGuided( pTemp = pMan, vPios );
    Aig_ManStop( pTemp );
    Vec_PtrFree( vPios );

    // reset levels
    pMan->pManTime = pManTime;
    Aig_ManChoiceLevel( pMan );

    // copy names
    ABC_FREE( pMan->pName );
    ABC_FREE( pMan->pSpec );
    pMan->pName = pName;
    pMan->pSpec = pSpec;
    return pMan;
}